

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O3

cio_error cio_http_server_register_location(cio_http_server *server,cio_http_location *location)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (location != (cio_http_location *)0x0 && server != (cio_http_server *)0x0) {
    location->next = server->first_location;
    server->first_location = location;
    server->num_handlers = server->num_handlers + 1;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

enum cio_error cio_http_server_register_location(struct cio_http_server *server, struct cio_http_location *location)
{
	if (cio_unlikely(server == NULL) || (location == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	location->next = server->first_location;
	server->first_location = location;
	server->num_handlers++;
	return CIO_SUCCESS;
}